

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<int,__1,_1,_0,__1,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::_set_noalias<Eigen::Matrix<int,3,1,0,3,1>>
          (PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *other)

{
  ActualDstType actualDst;
  assign_op<int,_int> local_9;
  
  internal::
  call_dense_assignment_loop<Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::Matrix<int,3,1,0,3,1>,Eigen::internal::assign_op<int,int>>
            ((Matrix<int,__1,_1,_0,__1,_1> *)this,(Matrix<int,_3,_1,_0,_3,_1> *)other,&local_9);
  return (Matrix<int,__1,_1,_0,__1,_1> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }